

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O3

SUNErrCode N_VDotProdMulti_ManyVector(int nvec,N_Vector x,N_Vector *Y,sunrealtype *dotprods)

{
  long lVar1;
  sunrealtype sVar2;
  
  if (0 < nvec) {
    lVar1 = 0;
    do {
      sVar2 = (sunrealtype)N_VDotProdLocal(x,Y[lVar1]);
      dotprods[lVar1] = sVar2;
      lVar1 = lVar1 + 1;
    } while (nvec != lVar1);
  }
  return 0;
}

Assistant:

SUNErrCode MVAPPEND(N_VDotProdMulti)(int nvec, N_Vector x, N_Vector* Y,
                                     sunrealtype* dotprods)
{
  SUNFunctionBegin(x->sunctx);
  sunindextype i;

  /* call N_VDotProdLocal for each <x,Y[i]> pair */
  for (i = 0; i < nvec; i++)
  {
    dotprods[i] = N_VDotProdLocal(x, Y[i]);
    SUNCheckLastErr();
  }

#ifdef MANYVECTOR_BUILD_WITH_MPI
  /* accumulate totals and return */
  if (MANYVECTOR_COMM(x) != MPI_COMM_NULL)
  {
    SUNCheckMPICall(MPI_Allreduce(MPI_IN_PLACE, dotprods, nvec, MPI_SUNREALTYPE,
                                  MPI_SUM, MANYVECTOR_COMM(x)));
  }
#endif

  /* return with success */
  return SUN_SUCCESS;
}